

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnComdatEntry
          (BinaryReaderObjdump *this,ComdatType kind,Index index)

{
  string_view sVar1;
  
  if (kind == Function) {
    PrintDetails(this,"    - func[%u]",(ulong)index);
    sVar1 = BinaryReaderObjdumpBase::GetFunctionName(&this->super_BinaryReaderObjdumpBase,index);
  }
  else {
    if (kind != Data) goto LAB_001149e8;
    PrintDetails(this,"    - segment[%u]",(ulong)index);
    sVar1 = BinaryReaderObjdumpBase::GetSegmentName(&this->super_BinaryReaderObjdumpBase,index);
  }
  if (sVar1._M_len != 0) {
    PrintDetails(this," <%.*s>",(ulong)(uint)sVar1._M_len,sVar1._M_str);
  }
LAB_001149e8:
  PrintDetails(this,"\n");
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnComdatEntry(ComdatType kind, Index index) {
  switch (kind) {
    case ComdatType::Data: {
      PrintDetails("    - segment[%" PRIindex "]", index);
      auto name = GetSegmentName(index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      break;
    }
    case ComdatType::Function: {
      PrintDetails("    - func[%" PRIindex "]", index);
      auto name = GetFunctionName(index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      break;
    }
  }
  PrintDetails("\n");
  return Result::Ok;
}